

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O2

uint32_t __thiscall FastPForLib::PFor2008::howmanybits(PFor2008 *this,uint32_t *in,size_t len)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar1 = 0;
  for (uVar3 = 0; uVar3 < len; uVar3 = uVar3 + 1) {
    uVar1 = uVar1 | in[uVar3];
  }
  uVar2 = 0x20;
  if (uVar1 < 0x10000) {
    uVar2 = (uint)(0xff < uVar1) * 8 + 8;
  }
  return uVar2;
}

Assistant:

uint32_t howmanybits(const uint32_t *in, const size_t len) {
    uint32_t accumulator = 0;
    for (uint32_t k = 0; k < len; ++k) {
      accumulator |= in[k];
    }
    if (accumulator >= (1U << 16))
      return 32;
    if (accumulator >= (1U << 8))
      return 16;
    return 8;
  }